

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

_Bool coll_tmap_contains_value(coll_tmap_t *map,void *value)

{
  entry_t_conflict *entry;
  
  for (entry = entry_first(map->root); (entry != (entry_t_conflict *)0x0 && (entry->val != value));
      entry = entry_next(entry)) {
  }
  return entry != (entry_t_conflict *)0x0;
}

Assistant:

bool coll_tmap_contains_value(coll_tmap_t *map, void *value) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        if (cur->val == value) {
            return true;
        }
        cur = entry_next(cur);
    }
    return false;
}